

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

int __thiscall Fl_Preferences::Node::nChildren(Node *this)

{
  int iVar1;
  
  if ((this->field_0x30 & 4) == 0) {
    iVar1 = 0;
    for (; this->child_ != (Node *)0x0; this = (Node *)&this->child_->next_) {
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = this->nIndex_;
  }
  return iVar1;
}

Assistant:

int Fl_Preferences::Node::nChildren() {
  if (indexed_) {
    return nIndex_;
  } else {
    int cnt = 0;
    for ( Node *nd = child_; nd; nd = nd->next_ )
      cnt++;
    return cnt;
  }
}